

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O1

void ArrayClear(array *a)

{
  ulong uVar1;
  ulong *__ptr;
  char *pcVar2;
  
  pcVar2 = a->_Begin;
  if (pcVar2 != (char *)0x0) {
    __ptr = (ulong *)(pcVar2 + -0x10);
    if ((long)*(ulong *)(pcVar2 + -0x10) < 0) {
      uVar1 = *__ptr;
      if ((uVar1 & 0x3fffffffffffffff) != 0) {
        (**(code **)(uVar1 + 8))(uVar1,__ptr,(uVar1 & 0x3fffffffffffffff) + 0x10);
      }
      if (uVar1 == 0) {
        pcVar2 = (char *)0x0;
      }
      else {
        if (-1 < *(long *)(uVar1 + 0x28)) {
          __assert_fail("Heap->Size & DATA_FLAG_MEMHEAP",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/array/array.c"
                        ,0x85,"void ArrayInitEx(array *, const cc_memheap *)");
        }
        pcVar2 = (char *)(uVar1 + 0x30);
      }
      a->_Begin = pcVar2;
      a->_Used = 0;
    }
    else {
      if (0x3fffffffffffffff < *(ulong *)(pcVar2 + -0x10)) {
        free(__ptr);
      }
      a->_Begin = (char *)0x0;
      a->_Used = 0;
    }
  }
  return;
}

Assistant:

NOINLINE void ArrayClear(array* a)
{
    if (!a->_Begin)
        return;
    datahead *hp = Data_Head(a);
    if (Data_IsMemHeap(hp))
    {
        dataheaphead *dp = Data_HeapHead(a);
        const struct cc_memheap* Heap = dp->Heap;
        if (Data_GetSize(hp))
            MemHeap_Free(Heap,dp,Data_GetSize(hp)+sizeof(dataheaphead));
        ArrayInitEx(a, Heap);
    }
    else if (Data_IsHeap(hp))
    {
        free(hp);
        a->_Begin = NULL;
        a->_Used = 0;
    }
    else
    {
        a->_Begin = NULL;
        a->_Used = 0;
    }
}